

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O1

void Mf_ManFree(Mf_Man_t *p)

{
  Vec_Mem_t *pVVar1;
  int *piVar2;
  void *__ptr;
  void **__ptr_00;
  long lVar3;
  
  if ((p->pPars->fGenCnf != 0) && ((p->vCnfSizes).nSize != p->vTtMem->nEntries)) {
    __assert_fail("!p->pPars->fGenCnf || Vec_IntSize(&p->vCnfSizes) == Vec_MemEntryNum(p->vTtMem)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                  ,0x585,"void Mf_ManFree(Mf_Man_t *)");
  }
  if ((p->pPars->fCutMin != 0) && (pVVar1 = p->vTtMem, pVVar1 != (Vec_Mem_t *)0x0)) {
    if (pVVar1->vTable != (Vec_Int_t *)0x0) {
      piVar2 = pVVar1->vTable->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        pVVar1->vTable->pArray = (int *)0x0;
      }
      if (pVVar1->vTable != (Vec_Int_t *)0x0) {
        free(pVVar1->vTable);
        pVVar1->vTable = (Vec_Int_t *)0x0;
      }
    }
    if (pVVar1->vNexts != (Vec_Int_t *)0x0) {
      piVar2 = pVVar1->vNexts->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        pVVar1->vNexts->pArray = (int *)0x0;
      }
      if (pVVar1->vNexts != (Vec_Int_t *)0x0) {
        free(pVVar1->vNexts);
        pVVar1->vNexts = (Vec_Int_t *)0x0;
      }
    }
  }
  if (p->pPars->fCutMin != 0) {
    pVVar1 = p->vTtMem;
    if (-1 < pVVar1->iPage) {
      lVar3 = -1;
      do {
        if (pVVar1->ppPages[lVar3 + 1] != (word *)0x0) {
          free(pVVar1->ppPages[lVar3 + 1]);
          pVVar1->ppPages[lVar3 + 1] = (word *)0x0;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < pVVar1->iPage);
    }
    if (pVVar1->ppPages != (word **)0x0) {
      free(pVVar1->ppPages);
      pVVar1->ppPages = (word **)0x0;
    }
    if (pVVar1 != (Vec_Mem_t *)0x0) {
      free(pVVar1);
    }
  }
  if (0 < (p->vPages).nSize) {
    lVar3 = 0;
    do {
      __ptr = (p->vPages).pArray[lVar3];
      if ((void *)0x2 < __ptr) {
        free(__ptr);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < (p->vPages).nSize);
  }
  piVar2 = (p->vCnfSizes).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vCnfSizes).pArray = (int *)0x0;
  }
  piVar2 = (p->vCnfMem).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vCnfMem).pArray = (int *)0x0;
  }
  __ptr_00 = (p->vPages).pArray;
  if (__ptr_00 != (void **)0x0) {
    free(__ptr_00);
    (p->vPages).pArray = (void **)0x0;
  }
  piVar2 = (p->vTemp).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vTemp).pArray = (int *)0x0;
  }
  if (p->pLfObjs != (Mf_Obj_t *)0x0) {
    free(p->pLfObjs);
    p->pLfObjs = (Mf_Obj_t *)0x0;
  }
  if (p != (Mf_Man_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Mf_ManFree( Mf_Man_t * p )
{
    assert( !p->pPars->fGenCnf || Vec_IntSize(&p->vCnfSizes) == Vec_MemEntryNum(p->vTtMem) );
    if ( p->pPars->fCutMin )
        Vec_MemHashFree( p->vTtMem );
    if ( p->pPars->fCutMin )
        Vec_MemFree( p->vTtMem );
    Vec_PtrFreeData( &p->vPages );
    ABC_FREE( p->vCnfSizes.pArray );
    ABC_FREE( p->vCnfMem.pArray );
    ABC_FREE( p->vPages.pArray );
    ABC_FREE( p->vTemp.pArray );
    ABC_FREE( p->pLfObjs );
    ABC_FREE( p );
}